

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O0

bool __thiscall ON_BrepEdgeArray::Read(ON_BrepEdgeArray *this,ON_BinaryArchive *file)

{
  bool bVar1;
  int iVar2;
  ON_BrepEdge *pOVar3;
  bool local_51;
  ON_BrepEdge *edge;
  int local_38;
  int iStack_34;
  bool rc;
  int minor_version;
  int major_version;
  int i;
  int count;
  ON__INT64 length_TCODE_ANONYMOUS_CHUNK;
  ON_BinaryArchive *pOStack_18;
  ON__UINT32 tcode;
  ON_BinaryArchive *file_local;
  ON_BrepEdgeArray *this_local;
  
  pOStack_18 = file;
  file_local = (ON_BinaryArchive *)this;
  ON_ClassArray<ON_BrepEdge>::Empty((ON_ClassArray<ON_BrepEdge> *)this);
  length_TCODE_ANONYMOUS_CHUNK._4_4_ = 0;
  _i = 0;
  major_version = 0;
  iStack_34 = 0;
  local_38 = 0;
  edge._7_1_ = ON_BinaryArchive::BeginRead3dmBigChunk
                         (pOStack_18,(uint *)((long)&length_TCODE_ANONYMOUS_CHUNK + 4),
                          (ON__INT64 *)&i);
  if (edge._7_1_) {
    if (length_TCODE_ANONYMOUS_CHUNK._4_4_ != 0x40008000) {
      edge._7_1_ = false;
    }
    if (edge._7_1_ != false) {
      edge._7_1_ = ON_BinaryArchive::Read3dmChunkVersion
                             (pOStack_18,&stack0xffffffffffffffcc,&local_38);
    }
    if (edge._7_1_ != false) {
      if (iStack_34 == 1) {
        if (edge._7_1_ != false) {
          edge._7_1_ = ON_BinaryArchive::ReadInt(pOStack_18,&major_version);
        }
        ON_ClassArray<ON_BrepEdge>::SetCapacity
                  ((ON_ClassArray<ON_BrepEdge> *)this,(long)major_version);
        minor_version = 0;
        while( true ) {
          local_51 = false;
          if (minor_version < major_version) {
            local_51 = edge._7_1_;
          }
          if (local_51 == false) break;
          pOVar3 = ON_ClassArray<ON_BrepEdge>::AppendNew((ON_ClassArray<ON_BrepEdge> *)this);
          iVar2 = (*(pOVar3->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
                    _vptr_ON_Object[0xb])(pOVar3,pOStack_18);
          edge._7_1_ = (bool)(-(char)iVar2 & 1);
          minor_version = minor_version + 1;
        }
      }
      else {
        edge._7_1_ = false;
      }
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(pOStack_18);
    if (!bVar1) {
      edge._7_1_ = false;
    }
  }
  return edge._7_1_;
}

Assistant:

bool ON_BrepEdgeArray::Read( ON_BinaryArchive& file )
{
  Empty();
  ON__UINT32 tcode = 0;
  ON__INT64 length_TCODE_ANONYMOUS_CHUNK = 0;
  int count = 0;
  int i;
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.BeginRead3dmBigChunk( &tcode, &length_TCODE_ANONYMOUS_CHUNK );
  if (rc) {
    if (tcode != TCODE_ANONYMOUS_CHUNK)
      rc = false;
    if (rc) rc = file.Read3dmChunkVersion(&major_version,&minor_version);
    if (rc) {
      if ( major_version==1 ) {
        if (rc) rc = file.ReadInt(&count);
        SetCapacity(count);
        for ( i = 0; i < count && rc ; i++ ) {
          ON_BrepEdge& edge = AppendNew();
          rc = edge.Read(file) ? true : false;
        }    
      }
      else {
        rc = 0;
      }
    }
    if ( !file.EndRead3dmChunk() )
      rc = false;
  }
  return rc;
}